

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::clear(PixelBufferAccess *access,Vec4 *color)

{
  int iVar1;
  int z_1;
  int z;
  int iVar2;
  int y;
  int iVar3;
  int y_1;
  int iVar4;
  anon_union_8_2_c961180f pixel;
  PixelBufferAccess local_58;
  
  iVar1 = TextureFormat::getPixelSize((TextureFormat *)access);
  iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
  iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
  if (((iVar1 == (access->super_ConstPixelBufferAccess).m_pitch.m_data[0]) && (iVar1 < 8)) &&
     (0x7f < iVar3 * iVar2 * iVar4)) {
    PixelBufferAccess::PixelBufferAccess(&local_58,(TextureFormat *)access,1,1,1,0,0,&pixel);
    PixelBufferAccess::setPixel(&local_58,color,0,0,0);
    for (iVar2 = 0; iVar2 < (access->super_ConstPixelBufferAccess).m_size.m_data[2];
        iVar2 = iVar2 + 1) {
      for (iVar3 = 0; iVar3 < (access->super_ConstPixelBufferAccess).m_size.m_data[1];
          iVar3 = iVar3 + 1) {
        fillRow(access,iVar3,iVar2,iVar1,pixel.u8);
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < iVar4; iVar1 = iVar1 + 1) {
      for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
        for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          PixelBufferAccess::setPixel(access,color,iVar3,iVar4,iVar1);
          iVar2 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
        }
        iVar3 = (access->super_ConstPixelBufferAccess).m_size.m_data[1];
      }
      iVar4 = (access->super_ConstPixelBufferAccess).m_size.m_data[2];
    }
  }
  return;
}

Assistant:

void clear (const PixelBufferAccess& access, const Vec4& color)
{
	const int	pixelSize				= access.getFormat().getPixelSize();
	const int	pixelPitch				= access.getPixelPitch();
	const bool	rowPixelsTightlyPacked	= (pixelSize == pixelPitch);

	if (access.getWidth()*access.getHeight()*access.getDepth() >= CLEAR_OPTIMIZE_THRESHOLD &&
		pixelSize < CLEAR_OPTIMIZE_MAX_PIXEL_SIZE && rowPixelsTightlyPacked)
	{
		// Convert to destination format.
		union
		{
			deUint8		u8[CLEAR_OPTIMIZE_MAX_PIXEL_SIZE];
			deUint64	u64; // Forces 64-bit alignment.
		} pixel;
		DE_STATIC_ASSERT(sizeof(pixel) == CLEAR_OPTIMIZE_MAX_PIXEL_SIZE);
		PixelBufferAccess(access.getFormat(), 1, 1, 1, 0, 0, &pixel.u8[0]).setPixel(color, 0, 0);

		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				fillRow(access, y, z, pixelSize, &pixel.u8[0]);
	}
	else
	{
		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				for (int x = 0; x < access.getWidth(); x++)
					access.setPixel(color, x, y, z);
	}
}